

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTConstantExpression.h
# Opt level: O2

double __thiscall
MathML::AST::ConstantExpression::unaryOperation<double>
          (ConstantExpression *this,double *operand,Operator op)

{
  ErrorHandler *pEVar1;
  ostream *poVar2;
  String *pSVar3;
  double dVar4;
  Error error;
  ostringstream oss;
  double local_1f8;
  String local_1e8;
  Error local_1c8;
  ostringstream local_198 [376];
  
  if (op == NOT) {
    dVar4 = (double)(-(ulong)(*operand == 0.0) & 0x3ff0000000000000);
  }
  else if (op == SUB) {
    dVar4 = -*operand;
  }
  else {
    if (op != ADD) {
      std::__cxx11::ostringstream::ostringstream(local_198);
      poVar2 = std::operator<<((ostream *)local_198,"invalid operator: ");
      pSVar3 = UnaryExpression::operatorString_abi_cxx11_(op);
      poVar2 = std::operator<<(poVar2,(string *)pSVar3);
      std::operator<<(poVar2,", cause operand not of type \'bool\' [f, t]");
      pEVar1 = this->mErrorHandler;
      if (pEVar1 != (ErrorHandler *)0x0) {
        std::__cxx11::stringbuf::str();
        Error::Error(&local_1c8,ERR_INVALIDPARAMS,&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        (**(code **)(*(long *)this->mErrorHandler + 0x10))(this->mErrorHandler,&local_1c8);
        local_1f8 = *operand;
        Error::~Error(&local_1c8);
      }
      std::__cxx11::ostringstream::~ostringstream(local_198);
      if (pEVar1 != (ErrorHandler *)0x0) {
        return local_1f8;
      }
    }
    dVar4 = *operand;
  }
  return dVar4;
}

Assistant:

T ConstantExpression::unaryOperation( const T& operand, UnaryExpression::Operator op ) const
        {
            switch ( op )
            {

            case AST::UnaryExpression::ADD:
                //do nothing
                return operand;

            case AST::UnaryExpression::SUB:
                return ( -operand );

            case AST::UnaryExpression::NOT:
                return ( !operand );

            default:
                std::ostringstream oss;
                oss << "invalid operator: " << AST::UnaryExpression::operatorString( op ) << ", cause operand not of type 'bool' [f, t]";
                if ( mErrorHandler )
                {
                    Error error( Error::ERR_INVALIDPARAMS, oss.str() );
                    mErrorHandler->handleError( &error );
                    return operand;
                }
            }
            return operand;
        }